

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O2

void __thiscall
cereal::PortableBinaryOutputArchive::saveBinary<8ul>
          (PortableBinaryOutputArchive *this,void *data,size_t size)

{
  long *plVar1;
  long lVar2;
  Exception *this_00;
  size_t i;
  ulong uVar3;
  unsigned_long __val;
  long lVar4;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->itsConvertEndianness == '\0') {
    plVar1 = *(long **)(this->itsStream + *(long *)(*(long *)this->itsStream + -0x18) + 0xe8);
    __val = (**(code **)(*plVar1 + 0x60))(plVar1,data,size);
  }
  else {
    __val = 0;
    for (uVar3 = 0; uVar3 < size; uVar3 = uVar3 + 8) {
      for (lVar4 = 7; lVar4 != -1; lVar4 = lVar4 + -1) {
        plVar1 = *(long **)(this->itsStream + *(long *)(*(long *)this->itsStream + -0x18) + 0xe8);
        lVar2 = (**(code **)(*plVar1 + 0x60))(plVar1,(long)data + lVar4,1);
        __val = __val + lVar2;
      }
      data = (void *)((long)data + 8);
    }
  }
  if (__val == size) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_b0,size);
  std::operator+(&local_90,"Failed to write ",&local_b0);
  std::operator+(&local_70,&local_90," bytes to output stream! Wrote ");
  std::__cxx11::to_string(&local_d0,__val);
  std::operator+(&local_50,&local_70,&local_d0);
  Exception::Exception(this_00,&local_50);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
      void saveBinary( const void * data, std::size_t size )
      {
        std::size_t writtenSize = 0;

        if( itsConvertEndianness )
        {
          for( std::size_t i = 0; i < size; i += DataSize )
            for( std::size_t j = 0; j < DataSize; ++j )
              writtenSize += static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ) + DataSize - j - 1 + i, 1 ) );
        }
        else
          writtenSize = static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ), size ) );

        if(writtenSize != size)
          throw Exception("Failed to write " + std::to_string(size) + " bytes to output stream! Wrote " + std::to_string(writtenSize));
      }